

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O0

void __thiscall tst_GenericModel::dragDropTree(tst_GenericModel *this)

{
  initializer_list<QModelIndex> args_00;
  initializer_list<QModelIndex> args_01;
  initializer_list<QModelIndex> args_02;
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ModelTest *pMVar6;
  long lVar7;
  const_reference pQVar8;
  qint32 local_12b4;
  qsizetype local_12b0;
  QSignalSpy *local_12a8;
  QSignalSpy *spy_5;
  QSignalSpy **__end1_5;
  QSignalSpy **__begin1_5;
  QSignalSpy *(*__range1_5) [2];
  QModelIndex local_1270;
  undefined1 local_1258 [8];
  value_type args_3;
  qsizetype local_1238;
  QSignalSpy *local_1230;
  QSignalSpy *spy_4;
  QSignalSpy **__end1_4;
  QSignalSpy **__begin1_4;
  QSignalSpy *(*__range1_4) [2];
  QVariant local_11f8;
  QModelIndex local_11d8;
  QModelIndex local_11c0;
  QVariant local_11a8;
  QModelIndex local_1188;
  QVariant local_1170;
  QModelIndex local_1150;
  QModelIndex local_1138;
  QVariant local_1120;
  QModelIndex local_1100;
  QModelIndex local_10e8;
  QModelIndex local_10d0;
  QModelIndex local_10b8;
  iterator local_10a0;
  undefined8 local_1098;
  QList<QModelIndex> local_1090;
  qint32 local_1074;
  qsizetype local_1070;
  QSignalSpy *local_1068;
  QSignalSpy *spy_3;
  QSignalSpy **__end1_3;
  QSignalSpy **__begin1_3;
  QSignalSpy *(*__range1_3) [2];
  QModelIndex local_1030;
  QModelIndex local_1018;
  undefined1 local_1000 [8];
  value_type args_2;
  qsizetype local_fe0;
  QSignalSpy *local_fd8;
  QSignalSpy *spy_2;
  QSignalSpy **__end1_2;
  QSignalSpy **__begin1_2;
  QSignalSpy *(*__range1_2) [2];
  QVariant local_fa0;
  QModelIndex local_f80;
  undefined1 local_f68 [24];
  undefined1 local_f50 [24];
  QModelIndex local_f38;
  QVariant local_f20;
  QModelIndex local_f00;
  QVariant local_ee8;
  QModelIndex local_ec8;
  undefined1 local_eb0 [24];
  undefined1 local_e98 [24];
  QModelIndex local_e80;
  QVariant local_e68;
  QModelIndex local_e48;
  undefined1 local_e30 [24];
  undefined1 local_e18 [28];
  int local_dfc;
  int j_4;
  undefined1 local_de0 [24];
  undefined1 local_dc8 [28];
  uint local_dac;
  int i_3;
  undefined1 local_d90 [24];
  undefined1 local_d78 [24];
  QModelIndex local_d60;
  undefined1 local_d48 [24];
  undefined1 local_d30 [24];
  QModelIndex local_d18;
  undefined1 local_d00 [24];
  QModelIndex local_ce8;
  QVariant local_cd0;
  QModelIndex local_cb0;
  undefined1 local_c98 [24];
  QModelIndex local_c80;
  QVariant local_c68;
  QModelIndex local_c48;
  undefined1 local_c30 [24];
  QModelIndex local_c18;
  QVariant local_c00;
  QModelIndex local_be0;
  undefined1 local_bc8 [24];
  QModelIndex local_bb0;
  QVariant local_b98;
  QModelIndex local_b78;
  undefined1 local_b60 [28];
  int local_b44;
  int j_3;
  undefined1 local_b28 [28];
  uint local_b0c;
  int i_2;
  undefined1 local_af0 [24];
  QModelIndex local_ad8;
  undefined1 local_ac0 [24];
  QModelIndex local_aa8;
  undefined1 local_a90 [24];
  QModelIndex local_a78;
  undefined1 local_a60 [24];
  QModelIndex local_a48;
  QModelIndex local_a30;
  QModelIndex local_a18;
  undefined1 local_a00 [24];
  QModelIndex local_9e8;
  iterator local_9c8;
  undefined8 local_9c0;
  QList<QModelIndex> local_9b8;
  QModelIndex local_9a0;
  undefined1 local_988 [8];
  value_type args_1;
  qsizetype local_968;
  QSignalSpy *local_960;
  QSignalSpy *spy_1;
  QSignalSpy **__end1_1;
  QSignalSpy **__begin1_1;
  QSignalSpy *(*__range1_1) [2];
  undefined1 local_928 [8];
  value_type args;
  qsizetype local_908;
  QSignalSpy *local_900;
  QSignalSpy *spy;
  QSignalSpy **__end1;
  QSignalSpy **__begin1;
  QSignalSpy *(*__range1) [2];
  QModelIndex local_8c8;
  QVariant local_8b0;
  QModelIndex local_890;
  QModelIndex local_878;
  QVariant local_860;
  QModelIndex local_840;
  QModelIndex local_828;
  QVariant local_810;
  QModelIndex local_7f0;
  QModelIndex local_7d8;
  QVariant local_7c0;
  QModelIndex local_7a0;
  undefined1 local_788 [24];
  QModelIndex local_770;
  QVariant local_758;
  QModelIndex local_738;
  undefined1 local_720 [24];
  QModelIndex local_708;
  QVariant local_6f0;
  QModelIndex local_6d0;
  undefined1 local_6b8 [24];
  QModelIndex local_6a0;
  QVariant local_688;
  QModelIndex local_668;
  undefined1 local_650 [24];
  QModelIndex local_638;
  QVariant local_620;
  QModelIndex local_600;
  undefined1 local_5e8 [28];
  int local_5cc;
  int j_2;
  undefined1 local_5b0 [28];
  uint local_594;
  int i_1;
  undefined1 local_578 [24];
  QModelIndex local_560;
  undefined1 local_548 [24];
  QModelIndex local_530;
  undefined1 local_518 [24];
  QModelIndex local_500;
  undefined1 local_4e8 [24];
  QModelIndex local_4d0;
  QModelIndex local_4b8;
  QModelIndex local_4a0;
  QModelIndex local_488;
  QModelIndex local_470;
  iterator local_458;
  undefined8 local_450;
  QList<QModelIndex> local_448;
  long local_430;
  QMimeData *mimeData;
  undefined1 auStack_410 [8];
  QModelIndex parIdx;
  QSignalSpy *columnSpies [2];
  QSignalSpy *rowSpies [2];
  QSignalSpy columnsInsertedSpy;
  QSignalSpy columnsAboutToBeInsertedSpy;
  QSignalSpy rowsInsertedSpy;
  undefined1 local_250 [8];
  QSignalSpy rowsAboutToBeInsertedSpy;
  undefined1 local_1b0 [24];
  int local_198;
  uint local_194;
  int j_1;
  int k;
  undefined1 local_178 [8];
  QModelIndex parIdx_1;
  QModelIndex local_140;
  undefined1 local_128 [24];
  QVariant local_110;
  QModelIndex local_f0;
  undefined1 local_d8 [24];
  QModelIndex local_c0;
  int local_a4;
  int j;
  uint local_84;
  int i;
  QModelIndex local_68;
  GenericModel local_40 [8];
  GenericModel destination;
  GenericModel local_28 [8];
  GenericModel source;
  tst_GenericModel *this_local;
  
  GenericModel::GenericModel(local_28,(QObject *)0x0);
  GenericModel::GenericModel(local_40,(QObject *)0x0);
  pMVar6 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(pMVar6,(QAbstractItemModel *)local_28,(QObject *)local_28);
  pMVar6 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(pMVar6,(QAbstractItemModel *)local_40,(QObject *)local_40);
  QModelIndex::QModelIndex(&local_68);
  GenericModel::insertColumns((int)local_28,0,(QModelIndex *)0x2);
  QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffff80);
  GenericModel::insertRows((int)local_28,0,(QModelIndex *)0x5);
  local_84 = 0;
  while( true ) {
    uVar5 = local_84;
    QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffff60);
    iVar3 = GenericModel::rowCount((QModelIndex *)local_28);
    if (iVar3 <= (int)uVar5) break;
    local_a4 = 0;
    while( true ) {
      iVar3 = local_a4;
      QModelIndex::QModelIndex(&local_c0);
      iVar4 = GenericModel::columnCount((QModelIndex *)local_28);
      uVar5 = local_84;
      if (iVar4 <= iVar3) break;
      QModelIndex::QModelIndex(&local_f0);
      GenericModel::index((int)local_d8,(int)local_28,(QModelIndex *)(ulong)uVar5);
      QVariant::QVariant(&local_110,local_a4 + local_84 * 10);
      GenericModel::setData((QModelIndex *)local_28,(QVariant *)local_d8,(int)&local_110);
      QVariant::~QVariant(&local_110);
      uVar5 = local_84;
      QModelIndex::QModelIndex(&local_140);
      GenericModel::index((int)local_128,(int)local_28,(QModelIndex *)(ulong)uVar5);
      QVariant::QVariant((QVariant *)&parIdx_1.m,local_a4 + 10 + local_84 * 10);
      GenericModel::setData((QModelIndex *)local_28,(QVariant *)local_128,(int)&parIdx_1 + 0x10);
      QVariant::~QVariant((QVariant *)&parIdx_1.m);
      local_a4 = local_a4 + 1;
    }
    QModelIndex::QModelIndex((QModelIndex *)&j_1);
    GenericModel::index((int)local_178,(int)local_28,(QModelIndex *)(ulong)uVar5);
    GenericModel::insertColumns((int)local_28,0,(QModelIndex *)0x2);
    GenericModel::insertRows((int)local_28,0,(QModelIndex *)0x3);
    for (local_194 = 0; uVar5 = local_194, iVar3 = GenericModel::rowCount((QModelIndex *)local_28),
        (int)uVar5 < iVar3; local_194 = local_194 + 1) {
      for (local_198 = 0; iVar3 = local_198,
          iVar4 = GenericModel::columnCount((QModelIndex *)local_28), iVar3 < iVar4;
          local_198 = local_198 + 1) {
        GenericModel::index((int)local_1b0,(int)local_28,(QModelIndex *)(ulong)local_194);
        QVariant::QVariant((QVariant *)&rowsAboutToBeInsertedSpy.m_waiting,
                           local_84 * 100 + local_198 * 10 + local_194);
        GenericModel::setData
                  ((QModelIndex *)local_28,(QVariant *)local_1b0,
                   (int)&rowsAboutToBeInsertedSpy + 0x78);
        QVariant::~QVariant((QVariant *)&rowsAboutToBeInsertedSpy.m_waiting);
      }
    }
    local_84 = local_84 + 1;
  }
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_250,(QObject *)local_40,
             "2rowsAboutToBeInserted(QModelIndex, int, int)");
  bVar1 = QSignalSpy::isValid((QSignalSpy *)local_250);
  bVar2 = QTest::qVerify(bVar1,"rowsAboutToBeInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0xbad);
  if ((bVar2 & 1) != 0) {
    QSignalSpy::QSignalSpy
              ((QSignalSpy *)&columnsAboutToBeInsertedSpy.m_waiting,(QObject *)local_40,
               "2rowsInserted(QModelIndex, int, int)");
    bVar1 = QSignalSpy::isValid((QSignalSpy *)&columnsAboutToBeInsertedSpy.m_waiting);
    bVar2 = QTest::qVerify(bVar1,"rowsInsertedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0xbaf);
    if ((bVar2 & 1) != 0) {
      QSignalSpy::QSignalSpy
                ((QSignalSpy *)&columnsInsertedSpy.m_waiting,(QObject *)local_40,
                 "2columnsAboutToBeInserted(QModelIndex, int, int)");
      bVar1 = QSignalSpy::isValid((QSignalSpy *)&columnsInsertedSpy.m_waiting);
      bVar2 = QTest::qVerify(bVar1,"columnsAboutToBeInsertedSpy.isValid()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0xbb1);
      if ((bVar2 & 1) != 0) {
        QSignalSpy::QSignalSpy
                  ((QSignalSpy *)(rowSpies + 1),(QObject *)local_40,
                   "2columnsInserted(QModelIndex, int, int)");
        columnSpies[1] = (QSignalSpy *)local_250;
        rowSpies[0] = (QSignalSpy *)&columnsAboutToBeInsertedSpy.m_waiting;
        parIdx.m = (QAbstractItemModel *)&columnsInsertedSpy.m_waiting;
        columnSpies[0] = (QSignalSpy *)(rowSpies + 1);
        QModelIndex::QModelIndex((QModelIndex *)&mimeData);
        GenericModel::index((int)auStack_410,(int)local_28,(QModelIndex *)0x1);
        QModelIndex::QModelIndex(&local_488);
        GenericModel::index((int)&local_470,(int)local_28,(QModelIndex *)0x0);
        local_458 = &local_470;
        local_450 = 1;
        args_02._M_len = 1;
        args_02._M_array = local_458;
        QList<QModelIndex>::QList(&local_448,args_02);
        lVar7 = GenericModel::mimeData((QList_conflict1 *)local_28);
        QList<QModelIndex>::~QList(&local_448);
        local_430 = lVar7;
        bVar2 = QTest::qVerify(lVar7 != 0,"mimeData","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,3000);
        lVar7 = local_430;
        if ((bVar2 & 1) != 0) {
          QModelIndex::QModelIndex(&local_4a0);
          bVar2 = GenericModel::dropMimeData
                            ((QMimeData *)local_40,(DropAction)lVar7,1,0,(QModelIndex *)0x0);
          bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                 "destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, QModelIndex())"
                                 ,"",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0xbb9);
          if (((bVar2 ^ 0xff) & 1) == 0) {
            QModelIndex::QModelIndex(&local_4b8);
            iVar3 = GenericModel::rowCount((QModelIndex *)local_40);
            bVar2 = QTest::qCompare(iVar3,1,"destination.rowCount()","1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0xbba);
            if (((bVar2 ^ 0xff) & 1) == 0) {
              QModelIndex::QModelIndex(&local_4d0);
              iVar3 = GenericModel::columnCount((QModelIndex *)local_40);
              bVar2 = QTest::qCompare(iVar3,1,"destination.columnCount()","1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0xbbb);
              if (((bVar2 ^ 0xff) & 1) == 0) {
                QModelIndex::QModelIndex(&local_500);
                GenericModel::index((int)local_4e8,(int)local_40,(QModelIndex *)0x0);
                iVar3 = GenericModel::rowCount((QModelIndex *)local_40);
                QModelIndex::QModelIndex(&local_530);
                GenericModel::index((int)local_518,(int)local_28,(QModelIndex *)0x0);
                iVar4 = GenericModel::rowCount((QModelIndex *)local_28);
                bVar2 = QTest::qCompare(iVar3,iVar4,"destination.rowCount(destination.index(0, 0))",
                                        "source.rowCount(source.index(0, 0))",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0xbbc);
                if (((bVar2 ^ 0xff) & 1) == 0) {
                  QModelIndex::QModelIndex(&local_560);
                  GenericModel::index((int)local_548,(int)local_40,(QModelIndex *)0x0);
                  iVar3 = GenericModel::columnCount((QModelIndex *)local_40);
                  QModelIndex::QModelIndex((QModelIndex *)&stack0xfffffffffffffa70);
                  GenericModel::index((int)local_578,(int)local_28,(QModelIndex *)0x0);
                  iVar4 = GenericModel::columnCount((QModelIndex *)local_28);
                  bVar2 = QTest::qCompare(iVar3,iVar4,
                                          "destination.columnCount(destination.index(0, 0))",
                                          "source.columnCount(source.index(0, 0))",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0xbbd);
                  if (((bVar2 ^ 0xff) & 1) == 0) {
                    local_594 = 0;
                    while( true ) {
                      uVar5 = local_594;
                      QModelIndex::QModelIndex((QModelIndex *)&stack0xfffffffffffffa38);
                      GenericModel::index((int)local_5b0,(int)local_40,(QModelIndex *)0x0);
                      iVar3 = GenericModel::rowCount((QModelIndex *)local_40);
                      if (iVar3 <= (int)uVar5) break;
                      local_5cc = 0;
                      while( true ) {
                        iVar3 = local_5cc;
                        QModelIndex::QModelIndex(&local_600);
                        GenericModel::index((int)local_5e8,(int)local_40,(QModelIndex *)0x0);
                        iVar4 = GenericModel::columnCount((QModelIndex *)local_40);
                        uVar5 = local_594;
                        if (iVar4 <= iVar3) break;
                        QModelIndex::QModelIndex(&local_668);
                        GenericModel::index((int)local_650,(int)local_40,(QModelIndex *)0x0);
                        GenericModel::index((int)&local_638,(int)local_40,
                                            (QModelIndex *)(ulong)uVar5);
                        QModelIndex::data(&local_620,&local_638,0);
                        iVar3 = QVariant::toInt((bool *)&local_620);
                        uVar5 = local_594;
                        QModelIndex::QModelIndex(&local_6d0);
                        GenericModel::index((int)local_6b8,(int)local_28,(QModelIndex *)0x0);
                        GenericModel::index((int)&local_6a0,(int)local_28,
                                            (QModelIndex *)(ulong)uVar5);
                        QModelIndex::data(&local_688,&local_6a0,0);
                        iVar4 = QVariant::toInt((bool *)&local_688);
                        bVar2 = QTest::qCompare(iVar3,iVar4,
                                                "destination.index(i, j, destination.index(0, 0)).data().toInt()"
                                                ,
                                                "source.index(i, j, source.index(0, 0)).data().toInt()"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0xbc0);
                        QVariant::~QVariant(&local_688);
                        QVariant::~QVariant(&local_620);
                        uVar5 = local_594;
                        if (((bVar2 ^ 0xff) & 1) != 0) goto LAB_0016e8f8;
                        QModelIndex::QModelIndex(&local_738);
                        GenericModel::index((int)local_720,(int)local_40,(QModelIndex *)0x0);
                        GenericModel::index((int)&local_708,(int)local_40,
                                            (QModelIndex *)(ulong)uVar5);
                        QModelIndex::data(&local_6f0,&local_708,0x100);
                        iVar3 = QVariant::toInt((bool *)&local_6f0);
                        uVar5 = local_594;
                        QModelIndex::QModelIndex(&local_7a0);
                        GenericModel::index((int)local_788,(int)local_28,(QModelIndex *)0x0);
                        GenericModel::index((int)&local_770,(int)local_28,
                                            (QModelIndex *)(ulong)uVar5);
                        QModelIndex::data(&local_758,&local_770,0x100);
                        iVar4 = QVariant::toInt((bool *)&local_758);
                        bVar2 = QTest::qCompare(iVar3,iVar4,
                                                "destination.index(i, j, destination.index(0, 0)).data(Qt::UserRole).toInt()"
                                                ,
                                                "source.index(i, j, source.index(0, 0)).data(Qt::UserRole).toInt()"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0xbc2);
                        QVariant::~QVariant(&local_758);
                        QVariant::~QVariant(&local_6f0);
                        if (((bVar2 ^ 0xff) & 1) != 0) goto LAB_0016e8f8;
                        local_5cc = local_5cc + 1;
                      }
                      local_594 = local_594 + 1;
                    }
                    QModelIndex::QModelIndex(&local_7f0);
                    GenericModel::index((int)&local_7d8,(int)local_40,(QModelIndex *)0x0);
                    QModelIndex::data(&local_7c0,&local_7d8,0);
                    iVar3 = QVariant::toInt((bool *)&local_7c0);
                    QModelIndex::QModelIndex(&local_840);
                    GenericModel::index((int)&local_828,(int)local_28,(QModelIndex *)0x0);
                    QModelIndex::data(&local_810,&local_828,0);
                    iVar4 = QVariant::toInt((bool *)&local_810);
                    bVar2 = QTest::qCompare(iVar3,iVar4,"destination.index(0, 0).data().toInt()",
                                            "source.index(0, 0).data().toInt()",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0xbc5);
                    QVariant::~QVariant(&local_810);
                    QVariant::~QVariant(&local_7c0);
                    if (((bVar2 ^ 0xff) & 1) == 0) {
                      QModelIndex::QModelIndex(&local_890);
                      GenericModel::index((int)&local_878,(int)local_40,(QModelIndex *)0x0);
                      QModelIndex::data(&local_860,&local_878,0x100);
                      iVar3 = QVariant::toInt((bool *)&local_860);
                      QModelIndex::QModelIndex((QModelIndex *)&__range1);
                      GenericModel::index((int)&local_8c8,(int)local_28,(QModelIndex *)0x0);
                      QModelIndex::data(&local_8b0,&local_8c8,0x100);
                      iVar4 = QVariant::toInt((bool *)&local_8b0);
                      bVar2 = QTest::qCompare(iVar3,iVar4,
                                              "destination.index(0, 0).data(Qt::UserRole).toInt()",
                                              "source.index(0, 0).data(Qt::UserRole).toInt()",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0xbc6);
                      QVariant::~QVariant(&local_8b0);
                      QVariant::~QVariant(&local_860);
                      if (((bVar2 ^ 0xff) & 1) == 0) {
                        spy = (QSignalSpy *)(rowSpies + 1);
                        __end1 = columnSpies + 1;
                        __begin1 = __end1;
                        for (; (QSignalSpy *)__end1 != spy; __end1 = __end1 + 1) {
                          local_900 = *__end1;
                          local_908 = QList<QList<QVariant>_>::count
                                                (&local_900->super_QList<QList<QVariant>_>);
                          args.d.size._4_4_ = 1;
                          bVar1 = QTest::qCompare<long_long,int>
                                            (&local_908,(qint32 *)((long)&args.d.size + 4),
                                             "spy->count()","1",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0xbc8);
                          if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0016e8f8;
                          QList<QList<QVariant>_>::takeFirst
                                    ((value_type *)local_928,
                                     &local_900->super_QList<QList<QVariant>_>);
                          pQVar8 = QList<QVariant>::at((QList<QVariant> *)local_928,0);
                          QVariant::value<QModelIndex>((QModelIndex *)&__range1_1,pQVar8);
                          bVar1 = QModelIndex::isValid((QModelIndex *)&__range1_1);
                          bVar2 = QTest::qVerify(!bVar1,"!args.at(0).value<QModelIndex>().isValid()"
                                                 ,"",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0xbca);
                          if (((bVar2 ^ 0xff) & 1) == 0) {
                            pQVar8 = QList<QVariant>::at((QList<QVariant> *)local_928,1);
                            iVar3 = QVariant::toInt((bool *)pQVar8);
                            bVar2 = QTest::qCompare(iVar3,0,"args.at(1).toInt()","0",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbcb);
                            if ((bVar2 & 1) == 0) {
                              bVar1 = true;
                            }
                            else {
                              pQVar8 = QList<QVariant>::at((QList<QVariant> *)local_928,2);
                              iVar3 = QVariant::toInt((bool *)pQVar8);
                              bVar2 = QTest::qCompare(iVar3,0,"args.at(2).toInt()","0",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbcc);
                              if ((bVar2 & 1) == 0) {
                                bVar1 = true;
                              }
                              else {
                                bVar1 = false;
                              }
                            }
                          }
                          else {
                            bVar1 = true;
                          }
                          QList<QVariant>::~QList((QList<QVariant> *)local_928);
                          if (bVar1) goto LAB_0016e8f8;
                        }
                        spy_1 = (QSignalSpy *)(columnSpies + 1);
                        __end1_1 = (QSignalSpy **)&parIdx.m;
                        __begin1_1 = __end1_1;
                        for (; (QSignalSpy *)__end1_1 != spy_1; __end1_1 = __end1_1 + 1) {
                          local_960 = *__end1_1;
                          local_968 = QList<QList<QVariant>_>::count
                                                (&local_960->super_QList<QList<QVariant>_>);
                          args_1.d.size._4_4_ = 1;
                          bVar1 = QTest::qCompare<long_long,int>
                                            (&local_968,(qint32 *)((long)&args_1.d.size + 4),
                                             "spy->count()","1",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0xbcf);
                          if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0016e8f8;
                          QList<QList<QVariant>_>::takeFirst
                                    ((value_type *)local_988,
                                     &local_960->super_QList<QList<QVariant>_>);
                          pQVar8 = QList<QVariant>::at((QList<QVariant> *)local_988,0);
                          QVariant::value<QModelIndex>(&local_9a0,pQVar8);
                          bVar1 = QModelIndex::isValid(&local_9a0);
                          bVar2 = QTest::qVerify(!bVar1,"!args.at(0).value<QModelIndex>().isValid()"
                                                 ,"",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0xbd1);
                          if (((bVar2 ^ 0xff) & 1) == 0) {
                            pQVar8 = QList<QVariant>::at((QList<QVariant> *)local_988,1);
                            iVar3 = QVariant::toInt((bool *)pQVar8);
                            bVar2 = QTest::qCompare(iVar3,0,"args.at(1).toInt()","0",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbd2);
                            if ((bVar2 & 1) == 0) {
                              bVar1 = true;
                            }
                            else {
                              pQVar8 = QList<QVariant>::at((QList<QVariant> *)local_988,2);
                              iVar3 = QVariant::toInt((bool *)pQVar8);
                              bVar2 = QTest::qCompare(iVar3,0,"args.at(2).toInt()","0",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbd3);
                              if ((bVar2 & 1) == 0) {
                                bVar1 = true;
                              }
                              else {
                                bVar1 = false;
                              }
                            }
                          }
                          else {
                            bVar1 = true;
                          }
                          QList<QVariant>::~QList((QList<QVariant> *)local_988);
                          if (bVar1) goto LAB_0016e8f8;
                        }
                        QObject::deleteLater();
                        local_9e8.m = (QAbstractItemModel *)parIdx.i;
                        local_9e8.r = auStack_410._0_4_;
                        local_9e8.c = auStack_410._4_4_;
                        local_9e8.i._0_4_ = parIdx.r;
                        local_9e8.i._4_4_ = parIdx.c;
                        local_9c8 = &local_9e8;
                        local_9c0 = 1;
                        args_01._M_len = 1;
                        args_01._M_array = local_9c8;
                        QList<QModelIndex>::QList(&local_9b8,args_01);
                        local_430 = GenericModel::mimeData((QList_conflict1 *)local_28);
                        QList<QModelIndex>::~QList(&local_9b8);
                        bVar2 = QTest::qVerify(local_430 != 0,"mimeData","",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0xbd8);
                        lVar7 = local_430;
                        if ((bVar2 & 1) != 0) {
                          QModelIndex::QModelIndex(&local_a18);
                          GenericModel::index((int)local_a00,(int)local_40,(QModelIndex *)0x0);
                          bVar2 = GenericModel::dropMimeData
                                            ((QMimeData *)local_40,(DropAction)lVar7,1,0,
                                             (QModelIndex *)0x0);
                          bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                 "destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, destination.index(0, 0))"
                                                 ,"",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0xbd9);
                          if (((bVar2 ^ 0xff) & 1) == 0) {
                            QModelIndex::QModelIndex(&local_a30);
                            iVar3 = GenericModel::rowCount((QModelIndex *)local_40);
                            bVar2 = QTest::qCompare(iVar3,1,"destination.rowCount()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbda);
                            if (((bVar2 ^ 0xff) & 1) == 0) {
                              QModelIndex::QModelIndex(&local_a48);
                              iVar3 = GenericModel::columnCount((QModelIndex *)local_40);
                              bVar2 = QTest::qCompare(iVar3,1,"destination.columnCount()","1",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbdb);
                              if (((bVar2 ^ 0xff) & 1) == 0) {
                                QModelIndex::QModelIndex(&local_a78);
                                GenericModel::index((int)local_a60,(int)local_40,(QModelIndex *)0x0)
                                ;
                                iVar3 = GenericModel::rowCount((QModelIndex *)local_40);
                                QModelIndex::QModelIndex(&local_aa8);
                                GenericModel::index((int)local_a90,(int)local_28,(QModelIndex *)0x0)
                                ;
                                iVar4 = GenericModel::rowCount((QModelIndex *)local_28);
                                bVar2 = QTest::qCompare(iVar3,iVar4 + 1,
                                                                                                                
                                                  "destination.rowCount(destination.index(0, 0))",
                                                  "source.rowCount(source.index(0, 0)) + 1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbdc);
                                if (((bVar2 ^ 0xff) & 1) == 0) {
                                  QModelIndex::QModelIndex(&local_ad8);
                                  GenericModel::index((int)local_ac0,(int)local_40,
                                                      (QModelIndex *)0x0);
                                  iVar3 = GenericModel::columnCount((QModelIndex *)local_40);
                                  QModelIndex::QModelIndex((QModelIndex *)&stack0xfffffffffffff4f8);
                                  GenericModel::index((int)local_af0,(int)local_28,
                                                      (QModelIndex *)0x0);
                                  iVar4 = GenericModel::columnCount((QModelIndex *)local_28);
                                  bVar2 = QTest::qCompare(iVar3,iVar4,
                                                                                                                    
                                                  "destination.columnCount(destination.index(0, 0))"
                                                  ,"source.columnCount(source.index(0, 0))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbdd);
                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                    local_b0c = 1;
                                    while( true ) {
                                      uVar5 = local_b0c;
                                      QModelIndex::QModelIndex
                                                ((QModelIndex *)&stack0xfffffffffffff4c0);
                                      GenericModel::index((int)local_b28,(int)local_40,
                                                          (QModelIndex *)0x0);
                                      iVar3 = GenericModel::rowCount((QModelIndex *)local_40);
                                      if (iVar3 <= (int)uVar5) break;
                                      local_b44 = 0;
                                      while( true ) {
                                        iVar3 = local_b44;
                                        QModelIndex::QModelIndex(&local_b78);
                                        GenericModel::index((int)local_b60,(int)local_40,
                                                            (QModelIndex *)0x0);
                                        iVar4 = GenericModel::columnCount((QModelIndex *)local_40);
                                        uVar5 = local_b0c;
                                        if (iVar4 <= iVar3) break;
                                        QModelIndex::QModelIndex(&local_be0);
                                        GenericModel::index((int)local_bc8,(int)local_40,
                                                            (QModelIndex *)0x0);
                                        GenericModel::index((int)&local_bb0,(int)local_40,
                                                            (QModelIndex *)(ulong)uVar5);
                                        QModelIndex::data(&local_b98,&local_bb0,0);
                                        iVar3 = QVariant::toInt((bool *)&local_b98);
                                        uVar5 = local_b0c - 1;
                                        QModelIndex::QModelIndex(&local_c48);
                                        GenericModel::index((int)local_c30,(int)local_28,
                                                            (QModelIndex *)0x0);
                                        GenericModel::index((int)&local_c18,(int)local_28,
                                                            (QModelIndex *)(ulong)uVar5);
                                        QModelIndex::data(&local_c00,&local_c18,0);
                                        iVar4 = QVariant::toInt((bool *)&local_c00);
                                        bVar2 = QTest::qCompare(iVar3,iVar4,
                                                                                                                                
                                                  "destination.index(i, j, destination.index(0, 0)).data().toInt()"
                                                  ,
                                                  "source.index(i - 1, j, source.index(0, 0)).data().toInt()"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbe0);
                                        QVariant::~QVariant(&local_c00);
                                        QVariant::~QVariant(&local_b98);
                                        uVar5 = local_b0c;
                                        if (((bVar2 ^ 0xff) & 1) != 0) goto LAB_0016e8f8;
                                        QModelIndex::QModelIndex(&local_cb0);
                                        GenericModel::index((int)local_c98,(int)local_40,
                                                            (QModelIndex *)0x0);
                                        GenericModel::index((int)&local_c80,(int)local_40,
                                                            (QModelIndex *)(ulong)uVar5);
                                        QModelIndex::data(&local_c68,&local_c80,0x100);
                                        iVar3 = QVariant::toInt((bool *)&local_c68);
                                        uVar5 = local_b0c - 1;
                                        QModelIndex::QModelIndex(&local_d18);
                                        GenericModel::index((int)local_d00,(int)local_28,
                                                            (QModelIndex *)0x0);
                                        GenericModel::index((int)&local_ce8,(int)local_28,
                                                            (QModelIndex *)(ulong)uVar5);
                                        QModelIndex::data(&local_cd0,&local_ce8,0x100);
                                        iVar4 = QVariant::toInt((bool *)&local_cd0);
                                        bVar2 = QTest::qCompare(iVar3,iVar4,
                                                                                                                                
                                                  "destination.index(i, j, destination.index(0, 0)).data(Qt::UserRole).toInt()"
                                                  ,
                                                  "source.index(i - 1, j, source.index(0, 0)).data(Qt::UserRole).toInt()"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbe2);
                                        QVariant::~QVariant(&local_cd0);
                                        QVariant::~QVariant(&local_c68);
                                        if (((bVar2 ^ 0xff) & 1) != 0) goto LAB_0016e8f8;
                                        local_b44 = local_b44 + 1;
                                      }
                                      local_b0c = local_b0c + 1;
                                    }
                                    QModelIndex::QModelIndex(&local_d60);
                                    GenericModel::index((int)local_d48,(int)local_40,
                                                        (QModelIndex *)0x0);
                                    GenericModel::index((int)local_d30,(int)local_40,
                                                        (QModelIndex *)0x0);
                                    iVar3 = GenericModel::rowCount((QModelIndex *)local_40);
                                    iVar4 = GenericModel::rowCount((QModelIndex *)local_28);
                                    bVar2 = QTest::qCompare(iVar3,iVar4,
                                                                                                                        
                                                  "destination.rowCount(destination.index(0, 0, destination.index(0, 0)))"
                                                  ,"source.rowCount(parIdx)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbe5);
                                    if (((bVar2 ^ 0xff) & 1) == 0) {
                                      QModelIndex::QModelIndex
                                                ((QModelIndex *)&stack0xfffffffffffff258);
                                      GenericModel::index((int)local_d90,(int)local_40,
                                                          (QModelIndex *)0x0);
                                      GenericModel::index((int)local_d78,(int)local_40,
                                                          (QModelIndex *)0x0);
                                      iVar3 = GenericModel::columnCount((QModelIndex *)local_40);
                                      iVar4 = GenericModel::columnCount((QModelIndex *)local_28);
                                      bVar2 = QTest::qCompare(iVar3,iVar4,
                                                                                                                            
                                                  "destination.columnCount(destination.index(0, 0, destination.index(0, 0)))"
                                                  ,"source.columnCount(parIdx)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbe6);
                                      if (((bVar2 ^ 0xff) & 1) == 0) {
                                        local_dac = 1;
                                        while( true ) {
                                          uVar5 = local_dac;
                                          QModelIndex::QModelIndex
                                                    ((QModelIndex *)&stack0xfffffffffffff208);
                                          GenericModel::index((int)local_de0,(int)local_40,
                                                              (QModelIndex *)0x0);
                                          GenericModel::index((int)local_dc8,(int)local_40,
                                                              (QModelIndex *)0x0);
                                          iVar3 = GenericModel::rowCount((QModelIndex *)local_40);
                                          if (iVar3 <= (int)uVar5) break;
                                          local_dfc = 0;
                                          while( true ) {
                                            iVar3 = local_dfc;
                                            QModelIndex::QModelIndex(&local_e48);
                                            GenericModel::index((int)local_e30,(int)local_40,
                                                                (QModelIndex *)0x0);
                                            GenericModel::index((int)local_e18,(int)local_40,
                                                                (QModelIndex *)0x0);
                                            iVar4 = GenericModel::columnCount
                                                              ((QModelIndex *)local_40);
                                            uVar5 = local_dac;
                                            if (iVar4 <= iVar3) break;
                                            QModelIndex::QModelIndex(&local_ec8);
                                            GenericModel::index((int)local_eb0,(int)local_40,
                                                                (QModelIndex *)0x0);
                                            GenericModel::index((int)local_e98,(int)local_40,
                                                                (QModelIndex *)0x0);
                                            GenericModel::index((int)&local_e80,(int)local_40,
                                                                (QModelIndex *)(ulong)uVar5);
                                            QModelIndex::data(&local_e68,&local_e80,0);
                                            iVar3 = QVariant::toInt((bool *)&local_e68);
                                            GenericModel::index((int)&local_f00,(int)local_28,
                                                                (QModelIndex *)(ulong)local_dac);
                                            QModelIndex::data(&local_ee8,&local_f00,0);
                                            iVar4 = QVariant::toInt((bool *)&local_ee8);
                                            bVar2 = QTest::qCompare(iVar3,iVar4,
                                                                                                                                        
                                                  "destination.index(i, j, destination.index(0, 0, destination.index(0, 0))).data().toInt()"
                                                  ,"source.index(i, j, parIdx).data().toInt()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbea);
                                            QVariant::~QVariant(&local_ee8);
                                            QVariant::~QVariant(&local_e68);
                                            uVar5 = local_dac;
                                            if (((bVar2 ^ 0xff) & 1) != 0) goto LAB_0016e8f8;
                                            QModelIndex::QModelIndex(&local_f80);
                                            GenericModel::index((int)local_f68,(int)local_40,
                                                                (QModelIndex *)0x0);
                                            GenericModel::index((int)local_f50,(int)local_40,
                                                                (QModelIndex *)0x0);
                                            GenericModel::index((int)&local_f38,(int)local_40,
                                                                (QModelIndex *)(ulong)uVar5);
                                            QModelIndex::data(&local_f20,&local_f38,0x100);
                                            iVar3 = QVariant::toInt((bool *)&local_f20);
                                            GenericModel::index((int)&__range1_2,(int)local_28,
                                                                (QModelIndex *)(ulong)local_dac);
                                            QModelIndex::data(&local_fa0,(QModelIndex *)&__range1_2,
                                                              0x100);
                                            iVar4 = QVariant::toInt((bool *)&local_fa0);
                                            bVar2 = QTest::qCompare(iVar3,iVar4,
                                                                                                                                        
                                                  "destination.index(i, j, destination.index(0, 0, destination.index(0, 0))).data(Qt::UserRole).toInt()"
                                                  ,
                                                  "source.index(i, j, parIdx).data(Qt::UserRole).toInt()"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbec);
                                            QVariant::~QVariant(&local_fa0);
                                            QVariant::~QVariant(&local_f20);
                                            if (((bVar2 ^ 0xff) & 1) != 0) goto LAB_0016e8f8;
                                            local_dfc = local_dfc + 1;
                                          }
                                          local_dac = local_dac + 1;
                                        }
                                        spy_2 = (QSignalSpy *)(rowSpies + 1);
                                        __end1_2 = columnSpies + 1;
                                        __begin1_2 = __end1_2;
                                        for (; (QSignalSpy *)__end1_2 != spy_2;
                                            __end1_2 = __end1_2 + 1) {
                                          local_fd8 = *__end1_2;
                                          local_fe0 = QList<QList<QVariant>_>::count
                                                                (&local_fd8->
                                                                  super_QList<QList<QVariant>_>);
                                          args_2.d.size._4_4_ = 1;
                                          bVar1 = QTest::qCompare<long_long,int>
                                                            (&local_fe0,
                                                             (qint32 *)((long)&args_2.d.size + 4),
                                                             "spy->count()","1",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbf0);
                                          if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0016e8f8;
                                          QList<QList<QVariant>_>::takeFirst
                                                    ((value_type *)local_1000,
                                                     &local_fd8->super_QList<QList<QVariant>_>);
                                          pQVar8 = QList<QVariant>::at((QList<QVariant> *)local_1000
                                                                       ,0);
                                          QVariant::value<QModelIndex>(&local_1018,pQVar8);
                                          QModelIndex::QModelIndex((QModelIndex *)&__range1_3);
                                          GenericModel::index((int)&local_1030,(int)local_40,
                                                              (QModelIndex *)0x0);
                                          bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                            (&local_1018,&local_1030,
                                                             "args.at(0).value<QModelIndex>()",
                                                             "destination.index(0, 0)",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbf2);
                                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                                            pQVar8 = QList<QVariant>::at((QList<QVariant> *)
                                                                         local_1000,1);
                                            iVar3 = QVariant::toInt((bool *)pQVar8);
                                            bVar2 = QTest::qCompare(iVar3,0,"args.at(1).toInt()","0"
                                                                    ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbf3);
                                            if ((bVar2 & 1) == 0) {
                                              bVar1 = true;
                                            }
                                            else {
                                              pQVar8 = QList<QVariant>::at((QList<QVariant> *)
                                                                           local_1000,2);
                                              iVar3 = QVariant::toInt((bool *)pQVar8);
                                              bVar2 = QTest::qCompare(iVar3,0,"args.at(2).toInt()",
                                                                      "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbf4);
                                              if ((bVar2 & 1) == 0) {
                                                bVar1 = true;
                                              }
                                              else {
                                                bVar1 = false;
                                              }
                                            }
                                          }
                                          else {
                                            bVar1 = true;
                                          }
                                          QList<QVariant>::~QList((QList<QVariant> *)local_1000);
                                          if (bVar1) goto LAB_0016e8f8;
                                        }
                                        spy_3 = (QSignalSpy *)(columnSpies + 1);
                                        __end1_3 = (QSignalSpy **)&parIdx.m;
                                        __begin1_3 = __end1_3;
                                        for (; (QSignalSpy *)__end1_3 != spy_3;
                                            __end1_3 = __end1_3 + 1) {
                                          local_1068 = *__end1_3;
                                          local_1070 = QList<QList<QVariant>_>::count
                                                                 (&local_1068->
                                                                   super_QList<QList<QVariant>_>);
                                          local_1074 = 0;
                                          bVar1 = QTest::qCompare<long_long,int>
                                                            (&local_1070,&local_1074,"spy->count()",
                                                             "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbf7);
                                          if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0016e8f8;
                                        }
                                        QObject::deleteLater();
                                        GenericModel::index((int)&local_10b8,(int)local_28,
                                                            (QModelIndex *)0x1);
                                        local_10a0 = &local_10b8;
                                        local_1098 = 1;
                                        args_00._M_len = 1;
                                        args_00._M_array = local_10a0;
                                        QList<QModelIndex>::QList(&local_1090,args_00);
                                        local_430 = GenericModel::mimeData
                                                              ((QList_conflict1 *)local_28);
                                        QList<QModelIndex>::~QList(&local_1090);
                                        bVar2 = QTest::qVerify(local_430 != 0,"mimeData","",
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbfb);
                                        lVar7 = local_430;
                                        if ((bVar2 & 1) != 0) {
                                          QModelIndex::QModelIndex(&local_10d0);
                                          bVar2 = GenericModel::dropMimeData
                                                            ((QMimeData *)local_40,(DropAction)lVar7
                                                             ,1,0,(QModelIndex *)0x0);
                                          bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                                  
                                                  "destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, QModelIndex())"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbfc);
                                          if (((bVar2 ^ 0xff) & 1) == 0) {
                                            QModelIndex::QModelIndex(&local_10e8);
                                            iVar3 = GenericModel::rowCount((QModelIndex *)local_40);
                                            bVar2 = QTest::qCompare(iVar3,2,"destination.rowCount()"
                                                                    ,"2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbfd);
                                            if (((bVar2 ^ 0xff) & 1) == 0) {
                                              QModelIndex::QModelIndex(&local_1100);
                                              iVar3 = GenericModel::columnCount
                                                                ((QModelIndex *)local_40);
                                              bVar2 = QTest::qCompare(iVar3,1,
                                                  "destination.columnCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbfe);
                                              if (((bVar2 ^ 0xff) & 1) == 0) {
                                                QModelIndex::QModelIndex(&local_1150);
                                                GenericModel::index((int)&local_1138,(int)local_40,
                                                                    (QModelIndex *)0x0);
                                                QModelIndex::data(&local_1120,&local_1138,0);
                                                iVar3 = QVariant::toInt((bool *)&local_1120);
                                                GenericModel::index((int)&local_1188,(int)local_28,
                                                                    (QModelIndex *)0x1);
                                                QModelIndex::data(&local_1170,&local_1188,0);
                                                iVar4 = QVariant::toInt((bool *)&local_1170);
                                                bVar2 = QTest::qCompare(iVar3,iVar4,
                                                                                                                                                
                                                  "destination.index(0, 0).data().toInt()",
                                                  "source.index(1, 1, parIdx).data().toInt()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xbff);
                                                QVariant::~QVariant(&local_1170);
                                                QVariant::~QVariant(&local_1120);
                                                if (((bVar2 ^ 0xff) & 1) == 0) {
                                                  QModelIndex::QModelIndex(&local_11d8);
                                                  GenericModel::index((int)&local_11c0,(int)local_40
                                                                      ,(QModelIndex *)0x0);
                                                  QModelIndex::data(&local_11a8,&local_11c0,0x100);
                                                  iVar3 = QVariant::toInt((bool *)&local_11a8);
                                                  GenericModel::index((int)&__range1_4,(int)local_28
                                                                      ,(QModelIndex *)0x1);
                                                  QModelIndex::data(&local_11f8,
                                                                    (QModelIndex *)&__range1_4,0x100
                                                                   );
                                                  iVar4 = QVariant::toInt((bool *)&local_11f8);
                                                  bVar2 = QTest::qCompare(iVar3,iVar4,
                                                                                                                                                    
                                                  "destination.index(0, 0).data(Qt::UserRole).toInt()"
                                                  ,
                                                  "source.index(1, 1, parIdx).data(Qt::UserRole).toInt()"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xc00);
                                                  QVariant::~QVariant(&local_11f8);
                                                  QVariant::~QVariant(&local_11a8);
                                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                                    spy_4 = (QSignalSpy *)(rowSpies + 1);
                                                    __end1_4 = columnSpies + 1;
                                                    __begin1_4 = __end1_4;
                                                    for (; (QSignalSpy *)__end1_4 != spy_4;
                                                        __end1_4 = __end1_4 + 1) {
                                                      local_1230 = *__end1_4;
                                                      local_1238 = QList<QList<QVariant>_>::count
                                                                             (&local_1230->
                                                                                                                                                              
                                                  super_QList<QList<QVariant>_>);
                                                  args_3.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_1238,
                                                                     (qint32 *)
                                                                     ((long)&args_3.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xc02);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0016e8f8;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_1258,
                                                             &local_1230->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar8 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_1258,0);
                                                  QVariant::value<QModelIndex>(&local_1270,pQVar8);
                                                  QModelIndex::QModelIndex
                                                            ((QModelIndex *)&__range1_5);
                                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_1270,
                                                                     (QModelIndex *)&__range1_5,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","QModelIndex()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xc04);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar8 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1258,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar8);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "args.at(1).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xc05);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar8 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1258,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar8);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "args.at(2).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xc06);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    bVar1 = false;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_1258);
                                                  if (bVar1) goto LAB_0016e8f8;
                                                  }
                                                  spy_5 = (QSignalSpy *)(columnSpies + 1);
                                                  __end1_5 = (QSignalSpy **)&parIdx.m;
                                                  __begin1_5 = __end1_5;
                                                  for (; (QSignalSpy *)__end1_5 != spy_5;
                                                      __end1_5 = __end1_5 + 1) {
                                                    local_12a8 = *__end1_5;
                                                    local_12b0 = QList<QList<QVariant>_>::count
                                                                           (&local_12a8->
                                                                                                                                                          
                                                  super_QList<QList<QVariant>_>);
                                                  local_12b4 = 0;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_12b0,&local_12b4,
                                                                     "spy->count()","0",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0xc09);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0016e8f8;
                                                  }
                                                  QObject::deleteLater();
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_0016e8f8:
        QSignalSpy::~QSignalSpy((QSignalSpy *)(rowSpies + 1));
      }
      QSignalSpy::~QSignalSpy((QSignalSpy *)&columnsInsertedSpy.m_waiting);
    }
    QSignalSpy::~QSignalSpy((QSignalSpy *)&columnsAboutToBeInsertedSpy.m_waiting);
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_250);
  GenericModel::~GenericModel(local_40);
  GenericModel::~GenericModel(local_28);
  return;
}

Assistant:

void tst_GenericModel::dragDropTree()
{
    GenericModel source;
    GenericModel destination;
    new ModelTest(&source, &source);
    new ModelTest(&destination, &destination);
    source.insertColumns(0, 2);
    source.insertRows(0, 5);
    for (int i = 0; i < source.rowCount(); ++i) {
        for (int j = 0; j < source.columnCount(); ++j) {
            source.setData(source.index(i, j), (10 * i) + j);
            source.setData(source.index(i, j), (10 * i) + j + 10, Qt::UserRole);
        }
        const QModelIndex parIdx = source.index(i, 0);
        source.insertColumns(0, 2, parIdx);
        source.insertRows(0, 3, parIdx);
        for (int k = 0; k < source.rowCount(parIdx); ++k) {
            for (int j = 0; j < source.columnCount(parIdx); ++j)
                source.setData(source.index(k, j, parIdx), (i * 100) + (10 * j) + k);
        }
    }
    QSignalSpy rowsAboutToBeInsertedSpy(&destination, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(rowsAboutToBeInsertedSpy.isValid());
    QSignalSpy rowsInsertedSpy(&destination, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(rowsInsertedSpy.isValid());
    QSignalSpy columnsAboutToBeInsertedSpy(&destination, SIGNAL(columnsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(columnsAboutToBeInsertedSpy.isValid());
    QSignalSpy columnsInsertedSpy(&destination, SIGNAL(columnsInserted(QModelIndex, int, int)));
    QSignalSpy *rowSpies[] = {&rowsAboutToBeInsertedSpy, &rowsInsertedSpy};
    QSignalSpy *columnSpies[] = {&columnsAboutToBeInsertedSpy, &columnsInsertedSpy};
    const QModelIndex parIdx = source.index(1, 0);

    QMimeData *mimeData = source.mimeData({source.index(0, 0)});
    QVERIFY(mimeData);
    QVERIFY(destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, QModelIndex()));
    QCOMPARE(destination.rowCount(), 1);
    QCOMPARE(destination.columnCount(), 1);
    QCOMPARE(destination.rowCount(destination.index(0, 0)), source.rowCount(source.index(0, 0)));
    QCOMPARE(destination.columnCount(destination.index(0, 0)), source.columnCount(source.index(0, 0)));
    for (int i = 0; i < destination.rowCount(destination.index(0, 0)); ++i) {
        for (int j = 0; j < destination.columnCount(destination.index(0, 0)); ++j) {
            QCOMPARE(destination.index(i, j, destination.index(0, 0)).data().toInt(), source.index(i, j, source.index(0, 0)).data().toInt());
            QCOMPARE(destination.index(i, j, destination.index(0, 0)).data(Qt::UserRole).toInt(),
                     source.index(i, j, source.index(0, 0)).data(Qt::UserRole).toInt());
        }
    }
    QCOMPARE(destination.index(0, 0).data().toInt(), source.index(0, 0).data().toInt());
    QCOMPARE(destination.index(0, 0).data(Qt::UserRole).toInt(), source.index(0, 0).data(Qt::UserRole).toInt());
    for (QSignalSpy *spy : rowSpies) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 0);
    }
    for (QSignalSpy *spy : columnSpies) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 0);
    }
    mimeData->deleteLater();

    mimeData = source.mimeData({parIdx});
    QVERIFY(mimeData);
    QVERIFY(destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, destination.index(0, 0)));
    QCOMPARE(destination.rowCount(), 1);
    QCOMPARE(destination.columnCount(), 1);
    QCOMPARE(destination.rowCount(destination.index(0, 0)), source.rowCount(source.index(0, 0)) + 1);
    QCOMPARE(destination.columnCount(destination.index(0, 0)), source.columnCount(source.index(0, 0)));
    for (int i = 1; i < destination.rowCount(destination.index(0, 0)); ++i) {
        for (int j = 0; j < destination.columnCount(destination.index(0, 0)); ++j) {
            QCOMPARE(destination.index(i, j, destination.index(0, 0)).data().toInt(), source.index(i - 1, j, source.index(0, 0)).data().toInt());
            QCOMPARE(destination.index(i, j, destination.index(0, 0)).data(Qt::UserRole).toInt(),
                     source.index(i - 1, j, source.index(0, 0)).data(Qt::UserRole).toInt());
        }
    }
    QCOMPARE(destination.rowCount(destination.index(0, 0, destination.index(0, 0))), source.rowCount(parIdx));
    QCOMPARE(destination.columnCount(destination.index(0, 0, destination.index(0, 0))), source.columnCount(parIdx));
    for (int i = 1; i < destination.rowCount(destination.index(0, 0, destination.index(0, 0))); ++i) {
        for (int j = 0; j < destination.columnCount(destination.index(0, 0, destination.index(0, 0))); ++j) {
            QCOMPARE(destination.index(i, j, destination.index(0, 0, destination.index(0, 0))).data().toInt(),
                     source.index(i, j, parIdx).data().toInt());
            QCOMPARE(destination.index(i, j, destination.index(0, 0, destination.index(0, 0))).data(Qt::UserRole).toInt(),
                     source.index(i, j, parIdx).data(Qt::UserRole).toInt());
        }
    }
    for (QSignalSpy *spy : rowSpies) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), destination.index(0, 0));
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 0);
    }
    for (QSignalSpy *spy : columnSpies)
        QCOMPARE(spy->count(), 0);
    mimeData->deleteLater();

    mimeData = source.mimeData({source.index(1, 1, parIdx)});
    QVERIFY(mimeData);
    QVERIFY(destination.dropMimeData(mimeData, Qt::CopyAction, 0, 0, QModelIndex()));
    QCOMPARE(destination.rowCount(), 2);
    QCOMPARE(destination.columnCount(), 1);
    QCOMPARE(destination.index(0, 0).data().toInt(), source.index(1, 1, parIdx).data().toInt());
    QCOMPARE(destination.index(0, 0).data(Qt::UserRole).toInt(), source.index(1, 1, parIdx).data(Qt::UserRole).toInt());
    for (QSignalSpy *spy : rowSpies) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 0);
    }
    for (QSignalSpy *spy : columnSpies)
        QCOMPARE(spy->count(), 0);
    mimeData->deleteLater();
}